

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void ReturnResponseThread<unsigned_int>
               (CMConnection conn,CMFormat ReadResponseFormat,AnonADIOSFile *f,size_t readSize,
               uint *RawData,void *Dest,int GetResponseCondition,Accuracy acc,string *name,
               DataType vartype,size_t stepStart,size_t stepCount,Dims *count,Dims *start,
               size_t blockid,bool boxselection)

{
  ostream *poVar1;
  void *this;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  void *in_R8;
  undefined8 in_R9;
  string *in_stack_00000028;
  ulong in_stack_00000038;
  long in_stack_00000040;
  ulong in_stack_00000058;
  byte in_stack_00000060;
  uint64_t in_stack_00000088;
  lock_guard<std::mutex> lockGuard;
  _ReadResponseMsg Response;
  mutex_type *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea8;
  ostream *in_stack_fffffffffffffeb0;
  string local_b0 [48];
  string local_80 [32];
  undefined1 local_60 [8];
  undefined8 local_58;
  undefined1 local_50;
  long local_48;
  void *local_40;
  byte local_31;
  undefined8 local_30;
  void *local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_31 = in_stack_00000060 & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_60,0,0x28);
  local_48 = local_20;
  local_58 = local_30;
  local_50 = 0x7f;
  local_40 = local_28;
  if (1 < verbose) {
    if ((local_31 & 1) == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Returning ");
      readable_size_abi_cxx11_(in_stack_00000088);
      poVar1 = std::operator<<(poVar1,local_b0);
      std::operator<<(poVar1," for Get<");
      poVar1 = adios2::operator<<(in_stack_fffffffffffffeb0,(DataType *)poVar1);
      poVar1 = std::operator<<(poVar1,">(");
      poVar1 = std::operator<<(poVar1,in_stack_00000028);
      in_stack_fffffffffffffe70 = std::operator<<(poVar1,") block = ");
      in_stack_fffffffffffffe68 =
           (mutex_type *)std::ostream::operator<<(in_stack_fffffffffffffe70,in_stack_00000058);
      std::ostream::operator<<(in_stack_fffffffffffffe68,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_b0);
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"Returning ");
      readable_size_abi_cxx11_(in_stack_00000088);
      poVar1 = std::operator<<(poVar1,local_80);
      std::operator<<(poVar1," for Get<");
      poVar1 = adios2::operator<<(in_stack_fffffffffffffeb0,(DataType *)in_stack_fffffffffffffea8);
      poVar1 = std::operator<<(poVar1,">(");
      poVar1 = std::operator<<(poVar1,in_stack_00000028);
      std::operator<<(poVar1,") start = ");
      poVar1 = adios2::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::operator<<(poVar1," count = ");
      poVar1 = adios2::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      poVar1 = std::operator<<(poVar1," steps = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_00000038);
      poVar1 = std::operator<<(poVar1,"..");
      this = (void *)std::ostream::operator<<(poVar1,(in_stack_00000038 - 1) + in_stack_00000040);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_80);
    }
  }
  CMwrite(local_8,local_10,local_60);
  free(local_40);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  *(long *)(local_18 + 0x60) = local_48 + *(long *)(local_18 + 0x60);
  *(long *)(local_18 + 0x68) = *(long *)(local_18 + 0x68) + 1;
  TotalGetBytesSent = local_48 + TotalGetBytesSent;
  TotalGets = TotalGets + 1;
  nThreads = nThreads - 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x134fb5);
  return;
}

Assistant:

void ReturnResponseThread(CMConnection conn, CMFormat ReadResponseFormat, AnonADIOSFile *f,
                          size_t readSize, T *RawData, void *Dest, int GetResponseCondition,
                          Accuracy acc, std::string name, adios2::DataType vartype,
                          size_t stepStart, size_t stepCount, adios2::Dims count,
                          adios2::Dims start, size_t blockid, bool boxselection)

{
    _ReadResponseMsg Response;
    memset(&Response, 0, sizeof(Response));
    Response.Size = readSize;
    Response.ReadResponseCondition = GetResponseCondition;
    Response.Dest = Dest; /* final data destination in client memory space */
    Response.OperatorType = Operator::OperatorType::COMPRESS_NULL;

    if (acc.error > 0.0)
    {
#if defined(ADIOS2_HAVE_MGARD) || defined(ADIOS2_HAVE_ZFP)
#if defined(ADIOS2_HAVE_MGARD)
        Params p = {{"accuracy", std::to_string(acc.error)},
                    {"s", std::to_string(acc.norm)},
                    {"mode", (acc.relative ? "REL" : "ABS")}};
        auto op = MakeOperator("mgard", p);
#elif defined(ADIOS2_HAVE_ZFP)
        Params p = {{"accuracy", std::to_string(acc.error)}};
        auto op = MakeOperator("zfp", p);
#endif
        // TODO: would be nicer:
        // op.SetAccuracy(Accuracy(GetMsg->error, GetMsg->norm, GetMsg->relative));
        T *CompressedData = (T *)malloc(Response.Size);
        adios2::Dims c;
        if (stepCount <= 1)
        {
            c = count;
        }
        else
        {
            c = helper::DimsWithStep(stepCount, count);
        }
        size_t result = op->Operate((char *)RawData, {}, c, vartype, (char *)CompressedData);
        if (result == 0)
        {
            Response.ReadData = (char *)RawData;
            free(CompressedData);
        }
        else
        {
            Response.ReadData = (char *)CompressedData;
            Response.Size = result;
            Response.OperatorType = op->m_TypeEnum;
            free(RawData);
        }
#else
        Response.ReadData = (char *)RawData;
#endif
    }
    else
    {
        Response.ReadData = (char *)RawData;
    }

    if (verbose >= 2)
    {
        if (boxselection)
        {
            std::cout << "Returning " << readable_size(Response.Size) << " for Get<" << vartype
                      << ">(" << name << ") start = " << start << " count = " << count
                      << " steps = " << stepStart << ".." << stepStart + stepCount - 1 << std::endl;
        }
        else
        {
            std::cout << "Returning " << readable_size(Response.Size) << " for Get<" << vartype
                      << ">(" << name << ") block = " << blockid << std::endl;
        }
    }
    // std::cout << "-- start sending response --" << std::endl;
    CMwrite(conn, ReadResponseFormat, &Response);
    free(Response.ReadData);
    // std::cout << "-- sent response --" << std::endl;
    {
        // std::cout << "-- get lock --" << std::endl;
        std::lock_guard<std::mutex> lockGuard(mutex_nThreads);
        // std::cout << "-- lock acquired --" << std::endl;
        f->m_BytesSent += Response.Size;
        f->m_OperationCount++;
        TotalGetBytesSent += Response.Size;
        TotalGets++;
        --nThreads;
    }
    // std::cout << "-- done --" << std::endl;
}